

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O0

void btGeometryUtil::getVerticesFromPlaneEquations
               (btAlignedObjectArray<btVector3> *planeEquations,
               btAlignedObjectArray<btVector3> *verticesOut)

{
  bool bVar1;
  btScalar *pbVar2;
  btAlignedObjectArray<btVector3> *in_RDI;
  btScalar bVar3;
  btVector3 bVar4;
  btVector3 potentialVertex;
  btScalar quotient;
  btVector3 n1n2;
  btVector3 n3n1;
  btVector3 n2n3;
  btVector3 *N3;
  int k;
  btVector3 *N2;
  int j;
  btVector3 *N1;
  int i;
  int numbrushes;
  btScalar local_bc;
  btScalar in_stack_ffffffffffffff48;
  btScalar in_stack_ffffffffffffff4c;
  btScalar in_stack_ffffffffffffff50;
  btScalar in_stack_ffffffffffffff54;
  btAlignedObjectArray<btVector3> *planeEquations_00;
  btAlignedObjectArray<btVector3> *local_98;
  btScalar local_90 [2];
  btScalar local_88 [2];
  btScalar abStack_80 [2];
  btVector3 local_78;
  btScalar local_68 [2];
  btScalar abStack_60 [2];
  btVector3 local_58;
  btVector3 *local_40;
  int local_34;
  btVector3 *local_30;
  int local_24;
  btVector3 *local_20;
  int local_18;
  int local_14;
  btAlignedObjectArray<btVector3> *local_8;
  
  local_8 = in_RDI;
  local_14 = btAlignedObjectArray<btVector3>::size(in_RDI);
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    local_20 = btAlignedObjectArray<btVector3>::operator[](local_8,local_18);
    local_24 = local_18;
    while (local_24 = local_24 + 1, local_24 < local_14) {
      local_30 = btAlignedObjectArray<btVector3>::operator[](local_8,local_24);
      local_34 = local_24;
      while (local_34 = local_34 + 1, local_34 < local_14) {
        local_40 = btAlignedObjectArray<btVector3>::operator[](local_8,local_34);
        btVector3::btVector3(&local_58);
        bVar4 = btVector3::cross((btVector3 *)
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                 (btVector3 *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        abStack_60 = bVar4.m_floats._8_8_;
        local_68 = bVar4.m_floats._0_8_;
        local_58.m_floats._0_8_ = local_68;
        local_58.m_floats._8_8_ = abStack_60;
        btVector3::btVector3(&local_78);
        bVar4 = btVector3::cross((btVector3 *)
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                 (btVector3 *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        abStack_80 = bVar4.m_floats._8_8_;
        local_88 = bVar4.m_floats._0_8_;
        local_78.m_floats._0_8_ = local_88;
        local_78.m_floats._8_8_ = abStack_80;
        btVector3::btVector3((btVector3 *)&local_98);
        bVar4 = btVector3::cross((btVector3 *)
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                 (btVector3 *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        local_90 = bVar4.m_floats._8_8_;
        planeEquations_00 = bVar4.m_floats._0_8_;
        local_98 = planeEquations_00;
        bVar3 = btVector3::length2((btVector3 *)0x154ebb);
        if (((0.0001 < bVar3) && (bVar3 = btVector3::length2((btVector3 *)0x154ed6), 0.0001 < bVar3)
            ) && (bVar3 = btVector3::length2((btVector3 *)0x154ef1), 0.0001 < bVar3)) {
          in_stack_ffffffffffffff54 = btVector3::dot(local_20,&local_58);
          bVar3 = btFabs(in_stack_ffffffffffffff54);
          if (1e-06 < bVar3) {
            in_stack_ffffffffffffff54 = -1.0 / in_stack_ffffffffffffff54;
            pbVar2 = btVector3::operator_cast_to_float_(local_20);
            btVector3::operator*=(&local_58,pbVar2 + 3);
            pbVar2 = btVector3::operator_cast_to_float_(local_30);
            btVector3::operator*=(&local_78,pbVar2 + 3);
            pbVar2 = btVector3::operator_cast_to_float_(local_40);
            btVector3::operator*=((btVector3 *)&local_98,pbVar2 + 3);
            local_bc = local_58.m_floats[0];
            in_stack_ffffffffffffff48 = local_58.m_floats[1];
            in_stack_ffffffffffffff4c = local_58.m_floats[2];
            in_stack_ffffffffffffff50 = local_58.m_floats[3];
            btVector3::operator+=((btVector3 *)&local_bc,&local_78);
            btVector3::operator+=((btVector3 *)&local_bc,(btVector3 *)&local_98);
            btVector3::operator*=((btVector3 *)&local_bc,(btScalar *)&stack0xffffffffffffff54);
            bVar1 = isPointInsidePlanes(planeEquations_00,
                                        (btVector3 *)
                                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ),in_stack_ffffffffffffff4c);
            if (bVar1) {
              btAlignedObjectArray<btVector3>::push_back
                        ((btAlignedObjectArray<btVector3> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
              ;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void	btGeometryUtil::getVerticesFromPlaneEquations(const btAlignedObjectArray<btVector3>& planeEquations , btAlignedObjectArray<btVector3>& verticesOut )
{
	const int numbrushes = planeEquations.size();
	// brute force:
	for (int i=0;i<numbrushes;i++)
	{
		const btVector3& N1 = planeEquations[i];
		

		for (int j=i+1;j<numbrushes;j++)
		{
			const btVector3& N2 = planeEquations[j];
				
			for (int k=j+1;k<numbrushes;k++)
			{

				const btVector3& N3 = planeEquations[k];

				btVector3 n2n3; n2n3 = N2.cross(N3);
				btVector3 n3n1; n3n1 = N3.cross(N1);
				btVector3 n1n2; n1n2 = N1.cross(N2);
				
				if ( ( n2n3.length2() > btScalar(0.0001) ) &&
					 ( n3n1.length2() > btScalar(0.0001) ) &&
					 ( n1n2.length2() > btScalar(0.0001) ) )
				{
					//point P out of 3 plane equations:

					//	d1 ( N2 * N3 ) + d2 ( N3 * N1 ) + d3 ( N1 * N2 )  
					//P =  -------------------------------------------------------------------------  
					//   N1 . ( N2 * N3 )  


					btScalar quotient = (N1.dot(n2n3));
					if (btFabs(quotient) > btScalar(0.000001))
					{
						quotient = btScalar(-1.) / quotient;
						n2n3 *= N1[3];
						n3n1 *= N2[3];
						n1n2 *= N3[3];
						btVector3 potentialVertex = n2n3;
						potentialVertex += n3n1;
						potentialVertex += n1n2;
						potentialVertex *= quotient;

						//check if inside, and replace supportingVertexOut if needed
						if (isPointInsidePlanes(planeEquations,potentialVertex,btScalar(0.01)))
						{
							verticesOut.push_back(potentialVertex);
						}
					}
				}
			}
		}
	}
}